

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QModelIndex>::growAppend
          (QCommonArrayOps<QModelIndex> *this,QModelIndex *b,QModelIndex *e)

{
  long lVar1;
  bool bVar2;
  QModelIndex *e_00;
  QModelIndex *in_RDX;
  QModelIndex *in_RSI;
  QGenericArrayOps<QModelIndex> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QModelIndex> *c;
  GrowthPosition where;
  QModelIndex *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (QModelIndex *)(((long)in_RDX - (long)in_RSI) / 0x18);
    c = (QCommonArrayOps<QModelIndex> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QModelIndex>::QArrayDataPointer
              ((QArrayDataPointer<QModelIndex> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QModelIndex>,QModelIndex_const*>
                      ((QModelIndex **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this_00,where,(qsizetype)in_RDI,
                 (QModelIndex **)in_RDX,(QArrayDataPointer<QModelIndex> *)e_00);
    }
    else {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                ((QArrayDataPointer<QModelIndex> *)this_00,where,(qsizetype)in_RDI,
                 (QModelIndex **)in_RDX,(QArrayDataPointer<QModelIndex> *)e_00);
    }
    QGenericArrayOps<QModelIndex>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }